

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

void cJSON_Delete(cJSON *item)

{
  cJSON *pcVar1;
  
  if (item != (cJSON *)0x0) {
    do {
      pcVar1 = item->next;
      if (((item->type & 0x100) == 0) && (item->child != (cJSON *)0x0)) {
        cJSON_Delete(item->child);
      }
      if (((item->type & 0x100) == 0) && (item->valuestring != (char *)0x0)) {
        (*global_hooks.deallocate)(item->valuestring);
        item->valuestring = (char *)0x0;
      }
      if (((item->type & 0x200) == 0) && (item->string != (char *)0x0)) {
        (*global_hooks.deallocate)(item->string);
        item->string = (char *)0x0;
      }
      (*global_hooks.deallocate)(item);
      item = pcVar1;
    } while (pcVar1 != (cJSON *)0x0);
  }
  return;
}

Assistant:

CJSON_PUBLIC(void) cJSON_Delete(cJSON *item)
{
    cJSON *next = NULL;
    while (item != NULL)
    {
        next = item->next;
        if (!(item->type & cJSON_IsReference) && (item->child != NULL))
        {
            cJSON_Delete(item->child);
        }
        if (!(item->type & cJSON_IsReference) && (item->valuestring != NULL))
        {
            global_hooks.deallocate(item->valuestring);
            item->valuestring = NULL;
        }
        if (!(item->type & cJSON_StringIsConst) && (item->string != NULL))
        {
            global_hooks.deallocate(item->string);
            item->string = NULL;
        }
        global_hooks.deallocate(item);
        item = next;
    }
}